

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O3

void skiwi::anon_unknown_23::load_test(void)

{
  ulong uVar1;
  char *pcVar2;
  string *psVar3;
  string script;
  skiwi_parameters params;
  long *local_b0 [2];
  long local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  skiwi_parameters local_50 [32];
  undefined8 local_30;
  undefined8 *puStack_28;
  undefined8 local_20;
  
  skiwi::skiwi_parameters::skiwi_parameters(local_50);
  local_30 = 0;
  puStack_28 = &std::cout;
  local_20 = 0;
  skiwi::scheme_with_skiwi(0,0);
  pcVar2 = "(load \"./data/load_test_1.scm\")";
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"(load \"./data/load_test_1.scm\")","");
  skiwi::skiwi_run((skiwi *)local_b0,(string *)pcVar2);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  psVar3 = (string *)0x200cb8;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"result","");
  uVar1 = skiwi::skiwi_run_raw((skiwi *)local_b0,psVar3);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)&local_70,uVar1,6);
  TestEq<char_const*,std::__cxx11::string>
            ("9",&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14ba,"void skiwi::(anonymous namespace)::load_test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = "\n(load (string-append \"./data/\" \"load_test_2.scm\"))\n(add3 5)\n";
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,
             "\n(load (string-append \"./data/\" \"load_test_2.scm\"))\n(add3 5)\n","");
  uVar1 = skiwi::skiwi_run_raw((skiwi *)local_b0,(string *)pcVar2);
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)&local_90,uVar1,6);
  TestEq<char_const*,std::__cxx11::string>
            ("8",&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14c8,"void skiwi::(anonymous namespace)::load_test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  skiwi::skiwi_quit((skiwi *)local_90._M_dataplus._M_p);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return;
}

Assistant:

void load_test()
    {
    using namespace skiwi;
    skiwi_parameters params;
    params.trace = nullptr;
    params.stderror = &std::cout;
    params.stdoutput = nullptr;
    scheme_with_skiwi(nullptr, nullptr, params);
#ifdef _WIN32
    skiwi_run("(load \"data\\\\load_test_1.scm\")");
#else
    skiwi_run("(load \"./data/load_test_1.scm\")");
#endif
    uint64_t res = skiwi_run_raw("result");
    TEST_EQ("9", skiwi_raw_to_string(res));

#ifdef _WIN32
    std::string script = R"(
(load (string-append "data\\" "load_test_2.scm"))
(add3 5)
)";
#else
    std::string script = R"(
(load (string-append "./data/" "load_test_2.scm"))
(add3 5)
)";
#endif
    res = skiwi_run_raw(script);
    TEST_EQ("8", skiwi_raw_to_string(res));
    skiwi_quit();
    }